

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::DoubleParameter::MergePartialFromCodedStream
          (DoubleParameter *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  double *pdVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  int iVar7;
  DoubleRange *this_00;
  ulong extraout_RAX;
  ulong uVar8;
  AllowedValuesUnion *pAVar9;
  int local_44;
  double local_40;
  AllowedValuesUnion *local_38;
  
  pAVar9 = &this->AllowedValues_;
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0026e71a;
      input->buffer_ = pbVar2 + 1;
      uVar8 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0026e71a:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar8 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar5 | uVar8;
    }
    uVar5 = (uint32)uVar8;
    if ((uVar8 & 0x100000000) == 0) {
LAB_0026e784:
      iVar7 = 7;
      if ((uVar5 & 7) != 4 && uVar5 != 0) {
        bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
        if (bVar4) goto LAB_0026e7a9;
LAB_0026e823:
        iVar7 = 6;
      }
    }
    else {
      uVar6 = (uint)(uVar8 >> 3) & 0x1fffffff;
      if (uVar6 == 10) {
        if ((char)uVar8 != 'R') goto LAB_0026e784;
        if (this->_oneof_case_[0] != 10) {
          this->_oneof_case_[0] = 10;
          local_38 = pAVar9;
          this_00 = (DoubleRange *)operator_new(0x28);
          DoubleRange::DoubleRange(this_00);
          (this->AllowedValues_).range_ = this_00;
          pAVar9 = local_38;
        }
        MergePartialFromCodedStream();
        iVar7 = local_44;
        if ((extraout_RAX & 1) != 0) goto LAB_0026e7ab;
      }
      else {
        if ((uVar6 != 1) || ((char)uVar8 != '\t')) goto LAB_0026e784;
        pdVar3 = (double *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pdVar3 < 8) {
          bVar4 = google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
                            (input,(uint64 *)&local_40);
          if (!bVar4) goto LAB_0026e823;
        }
        else {
          local_40 = *pdVar3;
          input->buffer_ = (uint8 *)(pdVar3 + 1);
        }
        this->defaultvalue_ = local_40;
      }
LAB_0026e7a9:
      iVar7 = 0;
    }
LAB_0026e7ab:
    if (iVar7 != 0) {
      return iVar7 != 6;
    }
  } while( true );
}

Assistant:

bool DoubleParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.DoubleParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // double defaultValue = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(9u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &defaultvalue_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.DoubleRange range = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_range()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.DoubleParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.DoubleParameter)
  return false;
#undef DO_
}